

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg.c
# Opt level: O1

int imsg_composev(imsgbuf *ibuf,u_int32_t type,u_int32_t peerid,pid_t pid,int fd,iovec *iov,
                 int iovcnt)

{
  u_int16_t datalen;
  int iVar1;
  ibuf *msg;
  long lVar2;
  
  iVar1 = 0;
  datalen = 0;
  if (0 < iovcnt) {
    lVar2 = 0;
    do {
      iVar1 = iVar1 + *(int *)((long)&iov->iov_len + lVar2);
      datalen = (u_int16_t)iVar1;
      lVar2 = lVar2 + 0x10;
    } while ((ulong)(uint)iovcnt << 4 != lVar2);
  }
  msg = imsg_create(ibuf,type,peerid,pid,datalen);
  iVar1 = -1;
  if (msg != (ibuf *)0x0) {
    if (0 < iovcnt) {
      lVar2 = 0;
      do {
        iVar1 = imsg_add(msg,*(void **)((long)&iov->iov_base + lVar2),
                         *(u_int16_t *)((long)&iov->iov_len + lVar2));
        if (iVar1 == -1) {
          return -1;
        }
        lVar2 = lVar2 + 0x10;
      } while ((ulong)(uint)iovcnt << 4 != lVar2);
    }
    msg->fd = fd;
    imsg_close(ibuf,msg);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int
imsg_composev(struct imsgbuf *ibuf, u_int32_t type, u_int32_t peerid,
    pid_t pid, int fd, const struct iovec *iov, int iovcnt)
{
	struct ibuf	*wbuf;
	int		 i, datalen = 0;

	for (i = 0; i < iovcnt; i++)
		datalen += iov[i].iov_len;

	if ((wbuf = imsg_create(ibuf, type, peerid, pid, datalen)) == NULL)
		return (-1);

	for (i = 0; i < iovcnt; i++)
		if (imsg_add(wbuf, iov[i].iov_base, iov[i].iov_len) == -1)
			return (-1);

	wbuf->fd = fd;

	imsg_close(ibuf, wbuf);

	return (1);
}